

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::dispose
          (ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this)

{
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar1;
  RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pRVar2;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar3;
  
  pTVar1 = this->ptr;
  if (pTVar1 != (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0) {
    pRVar2 = this->pos;
    pTVar3 = this->endPtr;
    this->ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    this->pos = (RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0;
    this->endPtr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pTVar1,0x30,((long)pRVar2 - (long)pTVar1) / 0x30,
               ((long)pTVar3 - (long)pTVar1) / 0x30,
               ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>,_false>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }